

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::clearBasis(SoPlexBase<double> *this)

{
  Status SVar1;
  
  SPxSolverBase<double>::reLoad(&this->_solver);
  SVar1 = SPxSolverBase<double>::status(&this->_solver);
  this->_status = SVar1;
  this->_hasBasis = false;
  SLUFactorRational::clear(&this->_rationalLUSolver);
  return;
}

Assistant:

void SoPlexBase<R>::clearBasis()
{
   _solver.reLoad();
   _status = _solver.status();
   _hasBasis = false;
   _rationalLUSolver.clear();
}